

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicClass.cpp
# Opt level: O0

void __thiscall
vkt::geometry::GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
          (GeometryExpanderRenderTestInstance *this,Context *context,
          VkPrimitiveTopology primitiveType,char *name)

{
  char *__s;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  allocator<char> local_29;
  char *local_28;
  char *name_local;
  Context *pCStack_18;
  VkPrimitiveTopology primitiveType_local;
  Context *context_local;
  GeometryExpanderRenderTestInstance *this_local;
  
  local_28 = name;
  name_local._4_4_ = primitiveType;
  pCStack_18 = context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  __s = local_28;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__GeometryExpanderRenderTestInstance_016cd4c8;
  this->m_primitiveType = name_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,__s,&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_vertexPosData);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_vertexAttrData);
  vki = Context::getInstanceInterface(pCStack_18);
  physDevice = Context::getPhysicalDevice(pCStack_18);
  checkGeometryShaderSupport(vki,physDevice,0);
  return;
}

Assistant:

GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance (Context&					context,
																		const VkPrimitiveTopology	primitiveType,
																		const char*					name)
	: TestInstance		(context)
	, m_primitiveType	(primitiveType)
	, m_name			(name)
{
	checkGeometryShaderSupport(context.getInstanceInterface(), context.getPhysicalDevice());
}